

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool Curl_compareheader(char *headerline,char *header,char *content)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *__s;
  byte *pbVar7;
  _Bool _Var8;
  
  sVar3 = strlen(header);
  iVar2 = Curl_strncasecompare(headerline,header,sVar3);
  if (iVar2 == 0) {
    _Var8 = false;
  }
  else {
    __s = (byte *)(headerline + sVar3);
    pbVar7 = __s;
    while ((bVar1 = *__s, (ulong)bVar1 != 0 &&
           (ppuVar4 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x20) != 0))) {
      __s = __s + 1;
      pbVar7 = pbVar7 + 1;
    }
    pbVar5 = (byte *)strchr((char *)__s,0xd);
    if ((pbVar5 == (byte *)0x0) && (pbVar5 = (byte *)strchr((char *)__s,10), pbVar5 == (byte *)0x0))
    {
      sVar3 = strlen((char *)__s);
      pbVar5 = __s + sVar3;
    }
    uVar6 = (long)pbVar5 - (long)pbVar7;
    sVar3 = strlen(content);
    while ((_Var8 = sVar3 <= uVar6, _Var8 &&
           (iVar2 = Curl_strncasecompare((char *)__s,content,sVar3), iVar2 == 0))) {
      uVar6 = uVar6 - 1;
      __s = __s + 1;
    }
  }
  return _Var8;
}

Assistant:

bool
Curl_compareheader(const char *headerline, /* line to check */
                   const char *header,  /* header keyword _with_ colon */
                   const char *content) /* content string to find */
{
  /* RFC2616, section 4.2 says: "Each header field consists of a name followed
   * by a colon (":") and the field value. Field names are case-insensitive.
   * The field value MAY be preceded by any amount of LWS, though a single SP
   * is preferred." */

  size_t hlen = strlen(header);
  size_t clen;
  size_t len;
  const char *start;
  const char *end;

  if(!strncasecompare(headerline, header, hlen))
    return FALSE; /* doesn't start with header */

  /* pass the header */
  start = &headerline[hlen];

  /* pass all white spaces */
  while(*start && ISSPACE(*start))
    start++;

  /* find the end of the header line */
  end = strchr(start, '\r'); /* lines end with CRLF */
  if(!end) {
    /* in case there's a non-standard compliant line here */
    end = strchr(start, '\n');

    if(!end)
      /* hm, there's no line ending here, use the zero byte! */
      end = strchr(start, '\0');
  }

  len = end-start; /* length of the content part of the input line */
  clen = strlen(content); /* length of the word to find */

  /* find the content string in the rest of the line */
  for(;len>=clen;len--, start++) {
    if(strncasecompare(start, content, clen))
      return TRUE; /* match! */
  }

  return FALSE; /* no match */
}